

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O0

void StatsObserver::printStats(void)

{
  bool bVar1;
  int __val;
  GameLoop *pGVar2;
  Map *this;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  size_type sVar4;
  vector<Player_*,_std::allocator<Player_*>_> *this_00;
  reference ppPVar5;
  size_type sVar6;
  ostream *poVar7;
  undefined1 auVar8 [16];
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  string percentage;
  undefined1 local_1e8 [8];
  string currentPlayer;
  Player *p;
  iterator __end1;
  iterator __begin1;
  vector<Player_*,_std::allocator<Player_*>_> *__range1;
  stringstream stream;
  int numberOfCountries;
  
  pGVar2 = GameLoop::getInstance();
  this = GameLoop::getGameMap(pGVar2);
  pvVar3 = Map::getMapCountries(this);
  sVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar3);
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  pGVar2 = GameLoop::getInstance();
  this_00 = GameLoop::getAllPlayers(pGVar2);
  __end1 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(this_00);
  p = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                *)&p);
    if (!bVar1) break;
    ppPVar5 = __gnu_cxx::
              __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
              operator*(&__end1);
    currentPlayer.field_2._8_8_ = *ppPVar5;
    pvVar3 = Player::getOwnedCountries((Player *)currentPlayer.field_2._8_8_);
    bVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::empty(pvVar3);
    if (!bVar1) {
      __val = Player::getPlayerId((Player *)currentPlayer.field_2._8_8_);
      std::__cxx11::to_string((string *)((long)&percentage.field_2 + 8),__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     "Player ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&percentage.field_2 + 8));
      std::__cxx11::string::~string((string *)(percentage.field_2._M_local_buf + 8));
      pvVar3 = Player::getOwnedCountries((Player *)currentPlayer.field_2._8_8_);
      sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar3);
      auVar8._8_4_ = (int)(sVar6 >> 0x20);
      auVar8._0_8_ = sVar6;
      auVar8._12_4_ = 0x45300000;
      std::__cxx11::to_string
                (&local_248,
                 (((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) /
                 (double)(int)sVar4) * 100.0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     &local_248,"%");
      std::__cxx11::string::~string((string *)&local_248);
      center(&local_268,(string *)local_1e8,10);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_268);
      std::operator<<(poVar7," | ");
      std::__cxx11::string::~string((string *)&local_268);
      pvVar3 = Player::getOwnedCountries((Player *)currentPlayer.field_2._8_8_);
      sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar3);
      std::__cxx11::to_string(&local_2a8,sVar6);
      center(&local_288,&local_2a8,0x14);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_288);
      std::operator<<(poVar7," | ");
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      center(&local_2c8,(string *)local_228,0x14);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_2c8);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)local_1e8);
    }
    __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
    operator++(&__end1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return;
}

Assistant:

void StatsObserver::printStats() {
    int numberOfCountries = GameLoop::getInstance()->getGameMap()->getMapCountries()->size();
    std::stringstream stream;

    for (auto* p : *GameLoop::getInstance()->getAllPlayers()) {
        if (!p->getOwnedCountries()->empty()) {
            std::string currentPlayer = "Player " + std::to_string(p->getPlayerId());
            std::string percentage = std::to_string(
                    static_cast<double>(p->getOwnedCountries()->size()) / static_cast<double>(numberOfCountries) * 100) + "%";
            std::cout << center(currentPlayer, 10) << " | ";
            std::cout << center(std::to_string(p->getOwnedCountries()->size()), 20) << " | ";
            std::cout << center(percentage, 20) << "\n";
        }
    }
}